

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O3

void LDSketch_get_heavy_keys(LDSketch_t *sk,longlong thresh,uchar *keys,longlong *vals,int *num_key)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *keys_00;
  longlong lVar5;
  int iVar6;
  size_t nmemb;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int tmp_n;
  int local_90;
  long *local_50 [2];
  long local_40 [2];
  
  iVar8 = sk->h;
  iVar2 = sk->w;
  nmemb = 0;
  if (0 < iVar8 * iVar2) {
    lVar10 = 0;
    do {
      if (thresh <= sk->tbl[lVar10]->max_value) {
        uVar1 = dyn_tbl_length(sk->tbl[lVar10]);
        if ((int)nmemb < (int)uVar1) {
          nmemb = (size_t)uVar1;
        }
        iVar8 = sk->h;
        iVar2 = sk->w;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar8 * iVar2);
  }
  iVar8 = sk->lgn;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"tmp heavy keys","");
  iVar2 = iVar8 + 7;
  if (-1 < iVar8) {
    iVar2 = iVar8;
  }
  keys_00 = (uchar *)safe_calloc(nmemb,(long)(iVar2 >> 3),(char *)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (sk->h * sk->w < 1) {
    local_90 = 0;
  }
  else {
    lVar10 = 0;
    local_90 = 0;
    do {
      if (thresh <= sk->tbl[lVar10]->max_value) {
        dyn_tbl_get_heavy_key(sk->tbl[lVar10],thresh,keys_00,(int *)local_50);
        if (0 < (int)local_50[0]) {
          iVar8 = 0;
          do {
            iVar2 = sk->lgn;
            iVar3 = iVar2 * iVar8;
            iVar6 = iVar3 + 7;
            if (-1 < iVar3) {
              iVar6 = iVar3;
            }
            if (0 < local_90) {
              iVar3 = iVar2 + 7;
              if (-1 < iVar2) {
                iVar3 = iVar2;
              }
              iVar9 = 0;
              iVar7 = local_90;
              do {
                iVar4 = iVar9 + 7;
                if (-1 < iVar9) {
                  iVar4 = iVar9;
                }
                iVar4 = bcmp(keys_00 + (iVar6 >> 3),keys + (iVar4 >> 3),(long)(iVar3 >> 3));
                if (iVar4 == 0) goto LAB_00104f3e;
                iVar9 = iVar9 + iVar2;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            lVar5 = LDSketch_up_estimate(sk,keys_00 + (iVar6 >> 3));
            if (thresh <= lVar5) {
              iVar2 = sk->lgn;
              iVar3 = iVar2 * local_90;
              iVar6 = iVar3 + 7;
              if (-1 < iVar3) {
                iVar6 = iVar3;
              }
              iVar7 = iVar2 * iVar8;
              iVar3 = iVar7 + 7;
              if (-1 < iVar7) {
                iVar3 = iVar7;
              }
              iVar7 = iVar2 + 7;
              if (-1 < iVar2) {
                iVar7 = iVar2;
              }
              memcpy(keys + (iVar6 >> 3),keys_00 + (iVar3 >> 3),(long)(iVar7 >> 3));
              vals[local_90] = lVar5;
              local_90 = local_90 + 1;
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < (int)local_50[0]);
        }
      }
LAB_00104f3e:
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)sk->h * (long)sk->w);
  }
  *num_key = local_90;
  return;
}

Assistant:

void LDSketch_get_heavy_keys(LDSketch_t* sk, long long thresh,
	unsigned char* keys, long long* vals,
	int* num_key) {
	int max_array_len = 0;
	for (int i = 0; i < sk->w * sk->h; ++i) {
		if (sk->tbl[i]->max_value >= thresh) {
			int len = dyn_tbl_length(sk->tbl[i]);
			if (len > max_array_len) {
				max_array_len = len;
			}
		}
	}

	unsigned char* tmp_keys = (unsigned char*)safe_calloc(
		max_array_len, sk->lgn / 8, std::string("tmp heavy keys").c_str());
	int tmp_n, n = 0;

	for (int i = 0; i < sk->w * sk->h; ++i) {
		if (sk->tbl[i]->max_value >= thresh) {
			dyn_tbl_get_heavy_key(sk->tbl[i], thresh, tmp_keys, &tmp_n);
			for (int j = 0; j < tmp_n; j++) {
				// deduplicate
				int k = 0;
				for (; k < n; k++) {
					if (memcmp(tmp_keys + j * sk->lgn / 8, keys + k * sk->lgn / 8,
						sk->lgn / 8) == 0) {
						break;
					}
				}
				if (k < n) {
					break;
				}

				long long v = LDSketch_up_estimate(sk, tmp_keys + j * sk->lgn / 8);
				if (v >= thresh) {
					memcpy(keys + n * sk->lgn / 8, tmp_keys + j * sk->lgn / 8,
						sk->lgn / 8);
					vals[n] = v;
					n++;
				}
			}
		}
	}

	*num_key = n;
}